

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<QString> args;
  QChar sep;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QLatin1StringView latin1_01;
  bool bVar1;
  char *pcVar2;
  ulong uVar3;
  iterator o;
  char **in_RSI;
  long in_FS_OFFSET;
  QList<QString> *command;
  QList<QList<QString>_> *__range1;
  int exitCode;
  QString formattedStartTime;
  QByteArray output;
  iterator __end1;
  iterator __begin1;
  QStringList installArgs;
  QStringList devices;
  QByteArray buildOutput;
  QCoreApplication a;
  undefined4 in_stack_fffffffffffffc48;
  CaseSensitivity in_stack_fffffffffffffc4c;
  int iVar4;
  TestRunnerSystemSemaphore *in_stack_fffffffffffffc50;
  memory_order __m;
  QListSpecialMethods<QString> *in_stack_fffffffffffffc58;
  QMessageLogger *in_stack_fffffffffffffc60;
  char **ppcVar5;
  undefined6 in_stack_fffffffffffffc68;
  undefined6 uVar6;
  undefined1 in_stack_fffffffffffffc6e;
  undefined1 uVar7;
  undefined1 in_stack_fffffffffffffc6f;
  undefined1 uVar8;
  QByteArray *in_stack_fffffffffffffc70;
  QString *in_stack_fffffffffffffc78;
  QMessageLogger *pQVar9;
  undefined8 in_stack_fffffffffffffc80;
  undefined7 in_stack_fffffffffffffc88;
  undefined7 uVar10;
  undefined1 in_stack_fffffffffffffc8f;
  TestRunnerSystemSemaphore *in_stack_fffffffffffffc90;
  QStringList *in_stack_fffffffffffffc98;
  QList<QList<QString>_> *args_00;
  int local_30c;
  QDebug local_2e8 [12];
  int local_2dc;
  undefined8 local_2d8;
  undefined8 local_2d0;
  undefined8 local_2c8;
  QChar local_2ba;
  QString local_2b8 [2];
  char local_288 [16];
  int *in_stack_fffffffffffffd88;
  QString *in_stack_fffffffffffffd90;
  iterator local_240;
  undefined8 local_238;
  undefined8 local_230;
  undefined8 local_228;
  char local_1d8 [80];
  char local_188 [32];
  char local_168 [32];
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  char local_118 [56];
  char local_e0 [32];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  QDebug local_88 [8];
  undefined8 local_80;
  undefined8 local_78;
  int local_6c;
  QMessageLogger local_68 [3];
  char *local_8;
  
  local_8 = *(char **)(in_FS_OFFSET + 0x28);
  local_30c = 0;
  signal(2,sigHandler);
  signal(0xf,sigHandler);
  local_80 = 0xaaaaaaaaaaaaaaaa;
  local_78 = 0xaaaaaaaaaaaaaaaa;
  QCoreApplication::QCoreApplication((QCoreApplication *)&local_80,&local_6c,in_RSI,0x60a00);
  bVar1 = parseOptions();
  if (bVar1) {
    bVar1 = QString::isEmpty((QString *)0x107711);
    if (bVar1) {
      QMessageLogger::QMessageLogger
                (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                 (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                 (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
      QMessageLogger::critical();
      QDebug::operator<<((QDebug *)
                         CONCAT17(in_stack_fffffffffffffc6f,
                                  CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)),
                         (char *)in_stack_fffffffffffffc98);
      QDebug::~QDebug(local_88);
      local_30c = -1;
    }
    else {
      local_c0 = 0xaaaaaaaaaaaaaaaa;
      local_b8 = 0xaaaaaaaaaaaaaaaa;
      local_b0 = 0xaaaaaaaaaaaaaaaa;
      QByteArray::QByteArray((QByteArray *)0x1077b8);
      bVar1 = execCommand(in_stack_fffffffffffffc78,in_stack_fffffffffffffc70,
                          (bool)in_stack_fffffffffffffc6f);
      if (bVar1) {
        uVar3 = QFile::exists(&g_options.apkPath);
        if ((uVar3 & 1) == 0) {
          QMessageLogger::QMessageLogger
                    (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                     (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                     (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
          QtPrivate::asString(&g_options.apkPath);
          QString::toLocal8Bit
                    ((QString *)
                     CONCAT17(in_stack_fffffffffffffc6f,
                              CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
          pcVar2 = QByteArray::constData((QByteArray *)0x1078d9);
          QMessageLogger::critical
                    (local_118,
                     "No apk \"%s\" found after running the make command. Check the provided path and the make command."
                     ,pcVar2);
          QByteArray::~QByteArray((QByteArray *)0x1078ff);
          local_30c = -1;
        }
        else {
          local_148 = 0xaaaaaaaaaaaaaaaa;
          local_140 = 0xaaaaaaaaaaaaaaaa;
          local_138 = 0xaaaaaaaaaaaaaaaa;
          runningDevices();
          bVar1 = QList<QString>::isEmpty((QList<QString> *)0x107961);
          if (bVar1) {
            QMessageLogger::QMessageLogger
                      (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                       (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                       (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
            QMessageLogger::critical
                      (local_168,"No connected devices or running emulators can be found.");
            local_30c = -1;
          }
          else {
            bVar1 = QString::isEmpty((QString *)0x1079be);
            if ((bVar1) ||
               (bVar1 = QListSpecialMethods<QString>::contains
                                  (in_stack_fffffffffffffc58,(QString *)in_stack_fffffffffffffc50,
                                   in_stack_fffffffffffffc4c), bVar1)) {
              obtainSdkVersion();
              userId();
              QString::operator=((QString *)in_stack_fffffffffffffc50,
                                 (QString *)
                                 CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              QString::~QString((QString *)0x107aa8);
              uVar3 = QFile::exists(&g_options.manifestPath);
              if ((uVar3 & 1) == 0) {
                QMessageLogger::QMessageLogger
                          (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                           (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                           (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                QtPrivate::asString(&g_options.manifestPath);
                QString::toLocal8Bit
                          ((QString *)
                           CONCAT17(in_stack_fffffffffffffc6f,
                                    CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
                pcVar2 = QByteArray::constData((QByteArray *)0x107b03);
                QMessageLogger::critical(local_1d8,"Unable to find \'%s\'.",pcVar2);
                QByteArray::~QByteArray((QByteArray *)0x107b29);
                local_30c = -1;
              }
              else {
                packageNameFromAndroidManifest(in_stack_fffffffffffffc78);
                QString::operator=((QString *)in_stack_fffffffffffffc50,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                QString::~QString((QString *)0x107b84);
                bVar1 = QString::isEmpty((QString *)0x107b97);
                if (bVar1) {
                  activityFromAndroidManifest(in_stack_fffffffffffffc78);
                  QString::operator=((QString *)in_stack_fffffffffffffc50,
                                     (QString *)
                                     CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                  QString::~QString((QString *)0x107bdd);
                }
                bVar1 = parseTestArgs();
                if (bVar1) {
                  TestRunnerSystemSemaphore::acquire(in_stack_fffffffffffffc50);
                  local_238 = 0xaaaaaaaaaaaaaaaa;
                  local_230 = 0xaaaaaaaaaaaaaaaa;
                  local_228 = 0xaaaaaaaaaaaaaaaa;
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
                  latin1.m_data._0_7_ = in_stack_fffffffffffffc88;
                  latin1.m_size = in_stack_fffffffffffffc80;
                  latin1.m_data._7_1_ = in_stack_fffffffffffffc8f;
                  QString::QString((QString *)in_stack_fffffffffffffc60,latin1);
                  ppcVar5 = &local_68[0].context.category;
                  uVar6 = SUB86(ppcVar5,0);
                  uVar7 = (undefined1)((ulong)ppcVar5 >> 0x30);
                  uVar8 = (undefined1)((ulong)ppcVar5 >> 0x38);
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
                  latin1_00.m_data._0_7_ = in_stack_fffffffffffffc88;
                  latin1_00.m_size = in_stack_fffffffffffffc80;
                  latin1_00.m_data._7_1_ = in_stack_fffffffffffffc8f;
                  QString::QString((QString *)in_stack_fffffffffffffc60,latin1_00);
                  Qt::Literals::StringLiterals::operator____L1
                            ((char *)in_stack_fffffffffffffc58,(size_t)in_stack_fffffffffffffc50);
                  latin1_01.m_data._0_7_ = in_stack_fffffffffffffc88;
                  latin1_01.m_size = in_stack_fffffffffffffc80;
                  latin1_01.m_data._7_1_ = in_stack_fffffffffffffc8f;
                  QString::QString((QString *)in_stack_fffffffffffffc60,latin1_01);
                  QString::QString((QString *)in_stack_fffffffffffffc50,
                                   (QString *)
                                   CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
                  args._M_len._0_6_ = uVar6;
                  args._M_array = (iterator)in_stack_fffffffffffffc60;
                  args._M_len._6_1_ = uVar7;
                  args._M_len._7_1_ = uVar8;
                  QList<QString>::QList((QList<QString> *)in_stack_fffffffffffffc58,args);
                  pQVar9 = local_68;
                  ppcVar5 = &local_8;
                  do {
                    ppcVar5 = &(((QMessageLogger *)(ppcVar5 + -4))->context).file;
                    QString::~QString((QString *)0x107d73);
                  } while ((QMessageLogger *)ppcVar5 != pQVar9);
                  execAdbCommand(in_stack_fffffffffffffc98,(QByteArray *)in_stack_fffffffffffffc90,
                                 (bool)in_stack_fffffffffffffc8f);
                  std::atomic<bool>::store
                            ((atomic<bool> *)in_stack_fffffffffffffc58,
                             SUB81((ulong)in_stack_fffffffffffffc50 >> 0x38,0),
                             (memory_order)in_stack_fffffffffffffc50);
                  bVar1 = std::atomic::operator_cast_to_bool
                                    ((atomic<bool> *)in_stack_fffffffffffffc58);
                  if (bVar1) {
                    args_00 = &g_options.preTestRunAdbCommands;
                    local_240.i = (QList<QString> *)0xaaaaaaaaaaaaaaaa;
                    local_240 = QList<QList<QString>_>::begin
                                          ((QList<QList<QString>_> *)in_stack_fffffffffffffc50);
                    o = QList<QList<QString>_>::end
                                  ((QList<QList<QString>_> *)in_stack_fffffffffffffc50);
                    while (bVar1 = QList<QList<QString>_>::iterator::operator!=(&local_240,o), bVar1
                          ) {
                      in_stack_fffffffffffffc90 =
                           (TestRunnerSystemSemaphore *)
                           QList<QList<QString>_>::iterator::operator*(&local_240);
                      QByteArray::QByteArray((QByteArray *)0x107edd);
                      bVar1 = execAdbCommand((QStringList *)args_00,
                                             (QByteArray *)in_stack_fffffffffffffc90,
                                             (bool)in_stack_fffffffffffffc8f);
                      if (!bVar1) {
                        uVar3 = (ulong)in_stack_fffffffffffffc50 >> 0x20;
                        in_stack_fffffffffffffc50 = in_stack_fffffffffffffc90;
                        QMessageLogger::QMessageLogger
                                  ((QMessageLogger *)ppcVar5,(char *)in_stack_fffffffffffffc58,
                                   (int)uVar3,
                                   (char *)CONCAT44(in_stack_fffffffffffffc4c,
                                                    in_stack_fffffffffffffc48));
                        in_stack_fffffffffffffc90 = in_stack_fffffffffffffc50;
                        QChar::QChar<char16_t,_true>(&local_2ba,L' ');
                        sep.ucs._1_1_ = uVar8;
                        sep.ucs._0_1_ = uVar7;
                        QListSpecialMethods<QString>::join(in_stack_fffffffffffffc58,sep);
                        QtPrivate::asString(local_2b8);
                        QString::toUtf8((QString *)
                                        CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48
                                                ));
                        in_stack_fffffffffffffc58 =
                             (QListSpecialMethods<QString> *)
                             QByteArray::constData((QByteArray *)0x107f72);
                        pcVar2 = QByteArray::constData((QByteArray *)0x107f84);
                        QMessageLogger::critical
                                  (local_288,
                                   "The pre test ADB command \"%s\" failed with output:\n%s",
                                   in_stack_fffffffffffffc58,pcVar2);
                        QByteArray::~QByteArray((QByteArray *)0x107faf);
                        QString::~QString((QString *)0x107fbc);
                        local_30c = -1;
                      }
                      QByteArray::~QByteArray((QByteArray *)0x107fec);
                      if (!bVar1) goto LAB_00108201;
                      QList<QList<QString>_>::iterator::operator++(&local_240);
                    }
                    local_2d8 = 0xaaaaaaaaaaaaaaaa;
                    local_2d0 = 0xaaaaaaaaaaaaaaaa;
                    local_2c8 = 0xaaaaaaaaaaaaaaaa;
                    getCurrentTimeString();
                    bVar1 = execAdbCommand((QStringList *)args_00,
                                           (QByteArray *)in_stack_fffffffffffffc90,
                                           (bool)in_stack_fffffffffffffc8f);
                    if (bVar1) {
                      waitForStarted();
                      waitForLoggingStarted();
                      bVar1 = setupStdoutLogger();
                      if (bVar1) {
                        waitForFinished();
                        bVar1 = stopStdoutLogger();
                        if (bVar1) {
                          local_2dc = testExitCode();
                          analyseLogcat(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
                          bVar1 = pullResults();
                          iVar4 = local_2dc;
                          if (!bVar1) {
                            iVar4 = -1;
                          }
                          local_2dc = iVar4;
                          bVar1 = uninstallTestPackage();
                          if (bVar1) {
                            TestRunnerSystemSemaphore::release(in_stack_fffffffffffffc50);
                            __m = (memory_order)((ulong)in_stack_fffffffffffffc50 >> 0x20);
                            bVar1 = std::atomic<bool>::load
                                              ((atomic<bool> *)in_stack_fffffffffffffc58,__m);
                            if (bVar1) {
                              QMessageLogger::QMessageLogger
                                        ((QMessageLogger *)ppcVar5,(char *)in_stack_fffffffffffffc58
                                         ,__m,(char *)CONCAT44(iVar4,in_stack_fffffffffffffc48));
                              QMessageLogger::critical();
                              QDebug::operator<<((QDebug *)CONCAT17(uVar8,CONCAT16(uVar7,uVar6)),
                                                 (char *)args_00);
                              QDebug::~QDebug(local_2e8);
                              local_30c = -1;
                            }
                            else {
                              local_30c = local_2dc;
                            }
                          }
                          else {
                            local_30c = -1;
                          }
                        }
                        else {
                          local_30c = -1;
                        }
                      }
                      else {
                        local_30c = -1;
                      }
                    }
                    else {
                      local_30c = -1;
                    }
                    QString::~QString((QString *)0x108201);
                  }
                  else {
                    local_30c = -1;
                  }
LAB_00108201:
                  QList<QString>::~QList((QList<QString> *)0x10820e);
                }
                else {
                  local_30c = -1;
                }
              }
            }
            else {
              QMessageLogger::QMessageLogger
                        (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                         (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                         (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
              QtPrivate::asString(&g_options.serial);
              QString::toLocal8Bit
                        ((QString *)
                         CONCAT17(in_stack_fffffffffffffc6f,
                                  CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
              pcVar2 = QByteArray::constData((QByteArray *)0x107a2e);
              QMessageLogger::critical
                        (local_188,
                         "No connected device or running emulator with serial \'%s\' can be found.",
                         pcVar2);
              QByteArray::~QByteArray((QByteArray *)0x107a54);
              local_30c = -1;
            }
          }
          QList<QString>::~QList((QList<QString> *)0x10821b);
        }
      }
      else {
        QMessageLogger::QMessageLogger
                  (in_stack_fffffffffffffc60,(char *)in_stack_fffffffffffffc58,
                   (int)((ulong)in_stack_fffffffffffffc50 >> 0x20),
                   (char *)CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48));
        QtPrivate::asString(&g_options.makeCommand);
        QString::toLocal8Bit
                  ((QString *)
                   CONCAT17(in_stack_fffffffffffffc6f,
                            CONCAT16(in_stack_fffffffffffffc6e,in_stack_fffffffffffffc68)));
        pcVar2 = QByteArray::constData((QByteArray *)0x107820);
        uVar10 = SUB87(pcVar2,0);
        uVar7 = (undefined1)((ulong)pcVar2 >> 0x38);
        pcVar2 = QByteArray::constData((QByteArray *)0x107832);
        QMessageLogger::critical
                  (local_e0,"The APK build command \"%s\" failed\n\n%s",CONCAT17(uVar7,uVar10),
                   pcVar2);
        QByteArray::~QByteArray((QByteArray *)0x10785d);
        local_30c = -1;
      }
      QByteArray::~QByteArray((QByteArray *)0x108228);
    }
  }
  else {
    printHelp();
    local_30c = -1;
  }
  QCoreApplication::~QCoreApplication((QCoreApplication *)&local_80);
  if (*(char **)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_30c;
}

Assistant:

int main(int argc, char *argv[])
{
    std::signal(SIGINT,  sigHandler);
    std::signal(SIGTERM, sigHandler);

    QCoreApplication a(argc, argv);
    if (!parseOptions()) {
        printHelp();
        return EXIT_ERROR;
    }

    if (g_options.makeCommand.isEmpty()) {
        qCritical() << "It is required to provide a make command with the \"--make\" parameter "
                       "to generate the apk.";
        return EXIT_ERROR;
    }

    QByteArray buildOutput;
    if (!execCommand(g_options.makeCommand, &buildOutput, true)) {
        qCritical("The APK build command \"%s\" failed\n\n%s",
            qPrintable(g_options.makeCommand), buildOutput.constData());
        return EXIT_ERROR;
    }

    if (!QFile::exists(g_options.apkPath)) {
        qCritical("No apk \"%s\" found after running the make command. "
                  "Check the provided path and the make command.",
                  qPrintable(g_options.apkPath));
        return EXIT_ERROR;
    }

    const QStringList devices = runningDevices();
    if (devices.isEmpty()) {
        qCritical("No connected devices or running emulators can be found.");
        return EXIT_ERROR;
    } else if (!g_options.serial.isEmpty() && !devices.contains(g_options.serial)) {
        qCritical("No connected device or running emulator with serial '%s' can be found.",
                  qPrintable(g_options.serial));
        return EXIT_ERROR;
    }

    obtainSdkVersion();

    g_testInfo.userId = userId();

    if (!QFile::exists(g_options.manifestPath)) {
        qCritical("Unable to find '%s'.", qPrintable(g_options.manifestPath));
        return EXIT_ERROR;
    }
    g_options.package = packageNameFromAndroidManifest(g_options.manifestPath);
    if (g_options.activity.isEmpty())
        g_options.activity = activityFromAndroidManifest(g_options.manifestPath);

    // parseTestArgs depends on g_options.package
    if (!parseTestArgs())
        return EXIT_ERROR;

    // do not install or run packages while another test is running
    testRunnerLock.acquire();

    const QStringList installArgs = { "install"_L1, "-r"_L1, "-g"_L1, g_options.apkPath };
    g_testInfo.isPackageInstalled.store(execAdbCommand(installArgs, nullptr));
    if (!g_testInfo.isPackageInstalled)
        return EXIT_ERROR;

    // Call additional adb command if set after installation and before starting the test
    for (const auto &command : g_options.preTestRunAdbCommands) {
        QByteArray output;
        if (!execAdbCommand(command, &output)) {
            qCritical("The pre test ADB command \"%s\" failed with output:\n%s",
                  qUtf8Printable(command.join(u' ')), output.constData());
            return EXIT_ERROR;
        }
    }

    // Pre test start
    const QString formattedStartTime = getCurrentTimeString();

    // Start the test
    if (!execAdbCommand(g_options.amStarttestArgs, nullptr))
        return EXIT_ERROR;

    waitForStarted();
    waitForLoggingStarted();

    if (!setupStdoutLogger())
        return EXIT_ERROR;

    waitForFinished();

    // Post test run
    if (!stopStdoutLogger())
        return EXIT_ERROR;

    int exitCode = testExitCode();

    analyseLogcat(formattedStartTime, &exitCode);

    exitCode = pullResults() ? exitCode : EXIT_ERROR;

    if (!uninstallTestPackage())
        return EXIT_ERROR;

    testRunnerLock.release();

    if (g_testInfo.isTestRunnerInterrupted.load()) {
        qCritical() << "The androidtestrunner was interrupted and the was test cleaned up.";
        return EXIT_ERROR;
    }

    return exitCode;
}